

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O1

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  Curl_addrinfo *__dest;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Curl_addrinfo *pCVar4;
  char *__dest_00;
  size_t __n;
  addrinfo *paVar5;
  Curl_addrinfo *pCVar6;
  addrinfo *aihead;
  Curl_addrinfo *local_50;
  addrinfo *local_40;
  Curl_addrinfo **local_38;
  
  *result = (Curl_addrinfo *)0x0;
  iVar2 = getaddrinfo(nodename,servname,(addrinfo *)hints,&local_40);
  if (iVar2 == 0) {
    local_38 = result;
    if (local_40 == (addrinfo *)0x0) {
      pCVar6 = (Curl_addrinfo *)0x0;
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      local_50 = (Curl_addrinfo *)0x0;
      pCVar6 = (Curl_addrinfo *)0x0;
      paVar5 = local_40;
      do {
        if (paVar5->ai_canonname == (char *)0x0) {
          sVar3 = 0;
        }
        else {
          sVar3 = strlen(paVar5->ai_canonname);
          sVar3 = sVar3 + 1;
        }
        if (paVar5->ai_family == 2) {
          __n = 0x10;
LAB_00120207:
          if ((paVar5->ai_addr == (sockaddr *)0x0) || (paVar5->ai_addrlen < (uint)__n))
          goto LAB_00120214;
          pCVar4 = (Curl_addrinfo *)(*Curl_cmalloc)(sVar3 + __n + 0x30);
          if (pCVar4 == (Curl_addrinfo *)0x0) {
            bVar1 = true;
            iVar2 = -10;
          }
          else {
            pCVar4->ai_flags = paVar5->ai_flags;
            pCVar4->ai_family = paVar5->ai_family;
            pCVar4->ai_socktype = paVar5->ai_socktype;
            pCVar4->ai_protocol = paVar5->ai_protocol;
            pCVar4->ai_addrlen = (uint)__n;
            __dest = pCVar4 + 1;
            pCVar4->ai_canonname = (char *)0x0;
            pCVar4->ai_addr = (sockaddr *)0x0;
            pCVar4->ai_next = (Curl_addrinfo *)0x0;
            pCVar4->ai_addr = (sockaddr *)__dest;
            memcpy(__dest,paVar5->ai_addr,__n);
            if (sVar3 != 0) {
              __dest_00 = (char *)((long)&__dest->ai_flags + __n);
              pCVar4->ai_canonname = __dest_00;
              memcpy(__dest_00,paVar5->ai_canonname,sVar3);
            }
            if (pCVar6 == (Curl_addrinfo *)0x0) {
              pCVar6 = pCVar4;
            }
            if (local_50 != (Curl_addrinfo *)0x0) {
              local_50->ai_next = pCVar4;
            }
            bVar1 = false;
            local_50 = pCVar4;
          }
        }
        else {
          if (paVar5->ai_family == 10) {
            __n = 0x1c;
            goto LAB_00120207;
          }
LAB_00120214:
          bVar1 = false;
        }
      } while ((!bVar1) && (paVar5 = paVar5->ai_next, paVar5 != (addrinfo *)0x0));
    }
    if (local_40 != (addrinfo *)0x0) {
      freeaddrinfo(local_40);
    }
    if (iVar2 == 0) {
      iVar2 = (uint)(pCVar6 != (Curl_addrinfo *)0x0) * 2 + -2;
    }
    else {
      while (pCVar6 != (Curl_addrinfo *)0x0) {
        pCVar4 = pCVar6->ai_next;
        (*Curl_cfree)(pCVar6);
        pCVar6 = pCVar4;
      }
      pCVar6 = (Curl_addrinfo *)0x0;
    }
    *local_38 = pCVar6;
  }
  return iVar2;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    struct Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  struct Curl_addrinfo *cafirst = NULL;
  struct Curl_addrinfo *calast = NULL;
  struct Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {
    size_t namelen = ai->ai_canonname ? strlen(ai->ai_canonname) + 1 : 0;
    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef USE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if(!ai->ai_addr || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(struct Curl_addrinfo) + ss_size + namelen);
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = (void *)((char *)ca + sizeof(struct Curl_addrinfo));
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(namelen) {
      ca->ai_canonname = (void *)((char *)ca->ai_addr + ss_size);
      memcpy(ca->ai_canonname, ai->ai_canonname, namelen);
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}